

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingStorey,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSpatialStructureElement *this;
  
  this = (IfcSpatialStructureElement *)operator_new(400);
  *(undefined ***)&this[1].super_IfcProduct.super_IfcObject.field_0x8 = &PTR__Object_0087f260;
  *(undefined8 *)&this[1].super_IfcProduct.super_IfcObject.field_0x10 = 0;
  *(char **)&this[1].super_IfcProduct.super_IfcObject.field_0x18 = "IfcBuildingStorey";
  Assimp::IFC::Schema_2x3::IfcSpatialStructureElement::IfcSpatialStructureElement
            (this,&PTR_construction_vtable_24__008d69b0);
  *(undefined8 *)&this->field_0x160 = 0;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject = &PTR__IfcBuildingStorey_008d68a8;
  *(undefined ***)&this[1].super_IfcProduct.super_IfcObject.field_0x8 =
       &PTR__IfcBuildingStorey_008d6998;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0x88 =
       &PTR__IfcBuildingStorey_008d68d0;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcBuildingStorey_008d68f8;
  *(undefined ***)&(this->super_IfcProduct).super_IfcObject.field_0xd0 =
       &PTR__IfcBuildingStorey_008d6920;
  *(undefined ***)&(this->super_IfcProduct).field_0x100 = &PTR__IfcBuildingStorey_008d6948;
  *(undefined ***)&this->field_0x158 = &PTR__IfcBuildingStorey_008d6970;
  *(undefined1 *)&this[1].super_IfcProduct.super_IfcObject = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcBuildingStorey>(db,params,(IfcBuildingStorey *)this);
  return (Object *)
         (&(this->super_IfcProduct).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcProduct).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }